

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Robot.cpp
# Opt level: O1

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* bMatrix(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *__return_storage_ptr__,double theta)

{
  void *pvVar1;
  long lVar2;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_02;
  allocator_type local_bc;
  allocator_type local_bb;
  allocator_type local_ba;
  allocator_type local_b9;
  double local_b8;
  vector<double,_std::allocator<double>_> local_b0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  double local_68 [4];
  double local_48;
  undefined8 local_40;
  double local_38;
  double local_30;
  undefined8 local_28;
  
  local_b8 = theta;
  local_38 = cos(theta);
  local_30 = sin(local_b8);
  local_30 = -local_30;
  local_28 = 0;
  __l._M_len = 3;
  __l._M_array = &local_38;
  std::vector<double,_std::allocator<double>_>::vector(&local_b0,__l,&local_b9);
  local_68[3] = sin(local_b8);
  local_48 = cos(local_b8);
  local_40 = 0;
  __l_00._M_len = 3;
  __l_00._M_array = local_68 + 3;
  std::vector<double,_std::allocator<double>_>::vector(&local_98,__l_00,&local_ba);
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 1.0;
  __l_01._M_len = 3;
  __l_01._M_array = local_68;
  std::vector<double,_std::allocator<double>_>::vector(&local_80,__l_01,&local_bb);
  __l_02._M_len = 3;
  __l_02._M_array = &local_b0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,__l_02,&local_bc);
  lVar2 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar2);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::vector<double> > bMatrix(double theta) {
    return {{std::cos(theta), -std::sin(theta), 0},
            {std::sin(theta), std::cos(theta), 0},
            {0, 0, 1}
    };
}